

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O0

int xmllintShellSetContent(xmllintShellCtxtPtr ctxt,char *value,xmlNodePtr node,xmlNodePtr node2)

{
  int iVar1;
  size_t sVar2;
  undefined8 uStack_38;
  xmlParserErrors ret;
  xmlNodePtr results;
  xmlNodePtr node2_local;
  xmlNodePtr node_local;
  char *value_local;
  xmllintShellCtxtPtr ctxt_local;
  
  if (ctxt != (xmllintShellCtxtPtr)0x0) {
    results = node2;
    node2_local = node;
    node_local = (xmlNodePtr)value;
    value_local = (char *)ctxt;
    if (node == (xmlNodePtr)0x0) {
      fprintf((FILE *)ctxt->output,"NULL\n");
    }
    else if (value == (char *)0x0) {
      fprintf((FILE *)ctxt->output,"NULL\n");
    }
    else {
      sVar2 = strlen(value);
      iVar1 = xmlParseInNodeContext(node,value,sVar2 & 0xffffffff,0,&stack0xffffffffffffffc8);
      if (iVar1 == 0) {
        if (node2_local->children != (_xmlNode *)0x0) {
          xmlFreeNodeList(node2_local->children);
          node2_local->children = (_xmlNode *)0x0;
          node2_local->last = (_xmlNode *)0x0;
        }
        xmlAddChildList(node2_local,uStack_38);
      }
      else {
        fprintf(*(FILE **)(value_local + 0x28),"failed to parse content\n");
      }
    }
  }
  return 0;
}

Assistant:

static int
xmllintShellSetContent(xmllintShellCtxtPtr ctxt ATTRIBUTE_UNUSED,
            char *value, xmlNodePtr node,
            xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlNodePtr results;
    xmlParserErrors ret;

    if (!ctxt)
        return (0);
    if (node == NULL) {
	fprintf(ctxt->output, "NULL\n");
	return (0);
    }
    if (value == NULL) {
        fprintf(ctxt->output, "NULL\n");
	return (0);
    }

    ret = xmlParseInNodeContext(node, value, strlen(value), 0, &results);
    if (ret == XML_ERR_OK) {
	if (node->children != NULL) {
	    xmlFreeNodeList(node->children);
	    node->children = NULL;
	    node->last = NULL;
	}
	xmlAddChildList(node, results);
    } else {
        fprintf(ctxt->output, "failed to parse content\n");
    }
    return (0);
}